

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateMoveResult(void)

{
  float fVar1;
  ImGuiContext *pIVar2;
  ImRect rect_abs;
  float scroll_target;
  ImVec2 delta_scroll;
  ImGuiNavMoveResult *result;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff98;
  ImRect *in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffac;
  ImGuiNavMoveResult *pIVar3;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImRect local_2c;
  float local_1c;
  ImVec2 local_18;
  ImGuiNavMoveResult *local_10;
  ImGuiContext *local_8;
  
  pIVar2 = GImGui;
  local_8 = GImGui;
  if (((GImGui->NavMoveResultLocal).ID == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
    if (GImGui->NavId == 0) {
      return;
    }
    GImGui->NavDisableHighlight = false;
    pIVar2->NavDisableMouseHover = true;
    return;
  }
  if ((GImGui->NavMoveResultLocal).ID == 0) {
    pIVar3 = &GImGui->NavMoveResultOther;
  }
  else {
    pIVar3 = &GImGui->NavMoveResultLocal;
  }
  local_10 = pIVar3;
  if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
      ((GImGui->NavMoveResultLocalVisibleSet).ID != 0)) &&
     ((GImGui->NavMoveResultLocalVisibleSet).ID != GImGui->NavId)) {
    local_10 = &GImGui->NavMoveResultLocalVisibleSet;
  }
  if (((local_10 != &GImGui->NavMoveResultOther) && ((GImGui->NavMoveResultOther).ID != 0)) &&
     (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
    if (local_10->DistBox <= (GImGui->NavMoveResultOther).DistBox) {
      fVar1 = (GImGui->NavMoveResultOther).DistBox;
      if (((fVar1 != local_10->DistBox) || (NAN(fVar1) || NAN(local_10->DistBox))) ||
         (local_10->DistCenter <= (GImGui->NavMoveResultOther).DistCenter)) goto LAB_0014a6f0;
    }
    local_10 = &GImGui->NavMoveResultOther;
  }
LAB_0014a6f0:
  if (GImGui->NavLayer == ImGuiNavLayer_Main) {
    ImVec2::ImVec2(&local_18);
    if ((local_8->NavMoveRequestFlags & 0x40U) == 0) {
      local_34 = operator+(in_stack_ffffffffffffff98,(ImVec2 *)0x14a79f);
      local_3c = operator+(in_stack_ffffffffffffff98,(ImVec2 *)0x14a7bd);
      in_stack_ffffffffffffffa0 = &local_2c;
      ImRect::ImRect(in_stack_ffffffffffffffa0,&local_34,&local_3c);
      local_18 = ScrollToBringRectIntoView(stack0x00000048,(ImRect *)rect_abs._4_8_);
    }
    else {
      if (local_8->NavMoveDir == 2) {
        in_stack_ffffffffffffffac = (local_10->Window->ScrollMax).y;
      }
      else {
        in_stack_ffffffffffffffac = 0.0;
      }
      local_18.y = (local_10->Window->Scroll).y - in_stack_ffffffffffffffac;
      local_1c = in_stack_ffffffffffffffac;
      SetScrollY(local_10->Window,in_stack_ffffffffffffffac);
    }
    ImRect::TranslateX(&local_10->RectRel,-local_18.x);
    ImRect::TranslateY(&local_10->RectRel,-local_18.y);
  }
  ClearActiveID();
  local_8->NavWindow = local_10->Window;
  if (local_8->NavId != local_10->ID) {
    local_8->NavJustMovedToId = local_10->ID;
    local_8->NavJustMovedToFocusScopeId = local_10->FocusScopeId;
    local_8->NavJustMovedToKeyMods = local_8->NavMoveRequestKeyMods;
  }
  SetNavIDWithRectRel((ImGuiID)((ulong)pIVar3 >> 0x20),(int)pIVar3,
                      (ImGuiID)in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
  return;
}

Assistant:

static void ImGui::NavUpdateMoveResult()
{
    ImGuiContext& g = *GImGui;
    if (g.NavMoveResultLocal.ID == 0 && g.NavMoveResultOther.ID == 0)
    {
        // In a situation when there is no results but NavId != 0, re-enable the Navigation highlight (because g.NavId is not considered as a possible result)
        if (g.NavId != 0)
        {
            g.NavDisableHighlight = false;
            g.NavDisableMouseHover = true;
        }
        return;
    }

    // Select which result to use
    ImGuiNavMoveResult* result = (g.NavMoveResultLocal.ID != 0) ? &g.NavMoveResultLocal : &g.NavMoveResultOther;

    // PageUp/PageDown behavior first jumps to the bottom/top mostly visible item, _otherwise_ use the result from the previous/next page.
    if (g.NavMoveRequestFlags & ImGuiNavMoveFlags_AlsoScoreVisibleSet)
        if (g.NavMoveResultLocalVisibleSet.ID != 0 && g.NavMoveResultLocalVisibleSet.ID != g.NavId)
            result = &g.NavMoveResultLocalVisibleSet;

    // Maybe entering a flattened child from the outside? In this case solve the tie using the regular scoring rules.
    if (result != &g.NavMoveResultOther && g.NavMoveResultOther.ID != 0 && g.NavMoveResultOther.Window->ParentWindow == g.NavWindow)
        if ((g.NavMoveResultOther.DistBox < result->DistBox) || (g.NavMoveResultOther.DistBox == result->DistBox && g.NavMoveResultOther.DistCenter < result->DistCenter))
            result = &g.NavMoveResultOther;
    IM_ASSERT(g.NavWindow && result->Window);

    // Scroll to keep newly navigated item fully into view.
    if (g.NavLayer == ImGuiNavLayer_Main)
    {
        ImVec2 delta_scroll;
        if (g.NavMoveRequestFlags & ImGuiNavMoveFlags_ScrollToEdge)
        {
            float scroll_target = (g.NavMoveDir == ImGuiDir_Up) ? result->Window->ScrollMax.y : 0.0f;
            delta_scroll.y = result->Window->Scroll.y - scroll_target;
            SetScrollY(result->Window, scroll_target);
        }
        else
        {
            ImRect rect_abs = ImRect(result->RectRel.Min + result->Window->Pos, result->RectRel.Max + result->Window->Pos);
            delta_scroll = ScrollToBringRectIntoView(result->Window, rect_abs);
        }

        // Offset our result position so mouse position can be applied immediately after in NavUpdate()
        result->RectRel.TranslateX(-delta_scroll.x);
        result->RectRel.TranslateY(-delta_scroll.y);
    }

    ClearActiveID();
    g.NavWindow = result->Window;
    if (g.NavId != result->ID)
    {
        // Don't set NavJustMovedToId if just landed on the same spot (which may happen with ImGuiNavMoveFlags_AllowCurrentNavId)
        g.NavJustMovedToId = result->ID;
        g.NavJustMovedToFocusScopeId = result->FocusScopeId;
        g.NavJustMovedToKeyMods = g.NavMoveRequestKeyMods;
    }
    IMGUI_DEBUG_LOG_NAV("[nav] NavMoveRequest: result NavID 0x%08X in Layer %d Window \"%s\"\n", result->ID, g.NavLayer, g.NavWindow->Name);
    SetNavIDWithRectRel(result->ID, g.NavLayer, result->FocusScopeId, result->RectRel);
}